

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  double dVar5;
  
  if (argc == 1) {
    puts("WORD VECTOR estimation toolkit v 0.1c\n");
    puts("Options:");
    puts("Parameters for training:");
    puts("\t-train <file>");
    puts("\t\tUse text data from <file> to train the model");
    puts("\t-output <file>");
    puts("\t\tUse <file> to save the resulting word vectors / word clusters");
    puts("\t-size <int>");
    puts("\t\tSet size of word vectors; default is 100");
    puts("\t-window <int>");
    puts("\t\tSet max skip length between words; default is 5");
    puts("\t-sample <float>");
    puts(
        "\t\tSet threshold for occurrence of words. Those that appear with higher frequency in the training data"
        );
    puts("\t\twill be randomly down-sampled; default is 1e-3, useful range is (0, 1e-5)");
    puts("\t-hs <int>");
    puts("\t\tUse Hierarchical Softmax; default is 0 (not used)");
    puts("\t-negative <int>");
    puts("\t\tNumber of negative examples; default is 5, common values are 3 - 10 (0 = not used)");
    puts("\t-threads <int>");
    puts("\t\tUse <int> threads (default 12)");
    puts("\t-iter <int>");
    puts("\t\tRun more training iterations (default 5)");
    puts("\t-min-count <int>");
    puts("\t\tThis will discard words that appear less than <int> times; default is 5");
    puts("\t-alpha <float>");
    puts("\t\tSet the starting learning rate; default is 0.025 for skip-gram and 0.05 for CBOW");
    puts("\t-classes <int>");
    puts(
        "\t\tOutput word classes rather than word vectors; default number of classes is 0 (vectors are written)"
        );
    puts("\t-debug <int>");
    puts("\t\tSet the debug mode (default = 2 = more info during training)");
    puts("\t-binary <int>");
    puts("\t\tSave the resulting vectors in binary moded; default is 0 (off)");
    puts("\t-output-classifier <int>");
    puts("\t\tOutput the classifier (one vector or the hierarchy); default is 0 (off)");
    puts("\t-save-vocab <file>");
    puts("\t\tThe vocabulary will be saved to <file>");
    puts("\t-read-vocab <file>");
    puts("\t\tThe vocabulary will be read from <file>, not constructed from the training data");
    puts("\t-cbow <int>");
    puts("\t\tUse the continuous bag of words model; default is 1 (use 0 for skip-gram model)");
    puts("\nExamples:");
    puts(
        "./word2vec -train data.txt -output vec.txt -size 200 -window 5 -sample 1e-4 -negative 5 -hs 0 -binary 0 -cbow 1 -iter 3\n"
        );
  }
  else {
    output_file[0] = '\0';
    save_vocab_file[0] = '\0';
    read_vocab_file[0] = '\0';
    uVar1 = ArgPos("-size",argc,argv);
    if (0 < (int)uVar1) {
      iVar2 = atoi(argv[(ulong)uVar1 + 1]);
      layer1_size = (longlong)iVar2;
    }
    uVar1 = ArgPos("-train",argc,argv);
    if (0 < (int)uVar1) {
      strcpy(train_file,argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-save-vocab",argc,argv);
    if (0 < (int)uVar1) {
      strcpy(save_vocab_file,argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-read-vocab",argc,argv);
    if (0 < (int)uVar1) {
      strcpy(read_vocab_file,argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-debug",argc,argv);
    if (0 < (int)uVar1) {
      debug_mode = atoi(argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-binary",argc,argv);
    if (0 < (int)uVar1) {
      binary = atoi(argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-output-classifier",argc,argv);
    if (0 < (int)uVar1) {
      strcpy(output_classifier,argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-cbow",argc,argv);
    if (0 < (int)uVar1) {
      cbow = atoi(argv[(ulong)uVar1 + 1]);
    }
    if (cbow != 0) {
      alpha = 0.05;
    }
    uVar1 = ArgPos("-alpha",argc,argv);
    if (0 < (int)uVar1) {
      dVar5 = atof(argv[(ulong)uVar1 + 1]);
      alpha = (real)dVar5;
    }
    uVar1 = ArgPos("-output",argc,argv);
    if (0 < (int)uVar1) {
      strcpy(output_file,argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-window",argc,argv);
    if (0 < (int)uVar1) {
      window = atoi(argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-sample",argc,argv);
    if (0 < (int)uVar1) {
      dVar5 = atof(argv[(ulong)uVar1 + 1]);
      sample = (real)dVar5;
    }
    uVar1 = ArgPos("-hs",argc,argv);
    if (0 < (int)uVar1) {
      hs = atoi(argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-negative",argc,argv);
    if (0 < (int)uVar1) {
      negative = atoi(argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-threads",argc,argv);
    if (0 < (int)uVar1) {
      num_threads = atoi(argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-iter",argc,argv);
    if (0 < (int)uVar1) {
      iVar2 = atoi(argv[(ulong)uVar1 + 1]);
      iter = (longlong)iVar2;
    }
    uVar1 = ArgPos("-min-count",argc,argv);
    if (0 < (int)uVar1) {
      min_count = atoi(argv[(ulong)uVar1 + 1]);
    }
    uVar1 = ArgPos("-classes",argc,argv);
    if (0 < (int)uVar1) {
      iVar2 = atoi(argv[(ulong)uVar1 + 1]);
      classes = (longlong)iVar2;
    }
    vocab = (vocab_word *)calloc(vocab_max_size,0x28);
    vocab_hash = (int *)calloc(30000000,4);
    expTable = (real *)malloc(0xfa4);
    lVar3 = 0;
    do {
      fVar4 = (float)(int)lVar3 / 1000.0;
      dVar5 = exp((double)((fVar4 + fVar4 + -1.0) * 6.0));
      expTable[lVar3] = (float)dVar5 / ((float)dVar5 + 1.0);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 1000);
    TrainModel();
    DestroyNet();
    free(vocab_hash);
    free(expTable);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  int i;
  if (argc == 1) {
    printf("WORD VECTOR estimation toolkit v 0.1c\n\n");
    printf("Options:\n");
    printf("Parameters for training:\n");
    printf("\t-train <file>\n");
    printf("\t\tUse text data from <file> to train the model\n");
    printf("\t-output <file>\n");
    printf("\t\tUse <file> to save the resulting word vectors / word clusters\n");
    printf("\t-size <int>\n");
    printf("\t\tSet size of word vectors; default is 100\n");
    printf("\t-window <int>\n");
    printf("\t\tSet max skip length between words; default is 5\n");
    printf("\t-sample <float>\n");
    printf("\t\tSet threshold for occurrence of words. Those that appear with higher frequency in the training data\n");
    printf("\t\twill be randomly down-sampled; default is 1e-3, useful range is (0, 1e-5)\n");
    printf("\t-hs <int>\n");
    printf("\t\tUse Hierarchical Softmax; default is 0 (not used)\n");
    printf("\t-negative <int>\n");
    printf("\t\tNumber of negative examples; default is 5, common values are 3 - 10 (0 = not used)\n");
    printf("\t-threads <int>\n");
    printf("\t\tUse <int> threads (default 12)\n");
    printf("\t-iter <int>\n");
    printf("\t\tRun more training iterations (default 5)\n");
    printf("\t-min-count <int>\n");
    printf("\t\tThis will discard words that appear less than <int> times; default is 5\n");
    printf("\t-alpha <float>\n");
    printf("\t\tSet the starting learning rate; default is 0.025 for skip-gram and 0.05 for CBOW\n");
    printf("\t-classes <int>\n");
    printf("\t\tOutput word classes rather than word vectors; default number of classes is 0 (vectors are written)\n");
    printf("\t-debug <int>\n");
    printf("\t\tSet the debug mode (default = 2 = more info during training)\n");
    printf("\t-binary <int>\n");
    printf("\t\tSave the resulting vectors in binary moded; default is 0 (off)\n");
    printf("\t-output-classifier <int>\n");
    printf("\t\tOutput the classifier (one vector or the hierarchy); default is 0 (off)\n");
    printf("\t-save-vocab <file>\n");
    printf("\t\tThe vocabulary will be saved to <file>\n");
    printf("\t-read-vocab <file>\n");
    printf("\t\tThe vocabulary will be read from <file>, not constructed from the training data\n");
    printf("\t-cbow <int>\n");
    printf("\t\tUse the continuous bag of words model; default is 1 (use 0 for skip-gram model)\n");
    printf("\nExamples:\n");
    printf("./word2vec -train data.txt -output vec.txt -size 200 -window 5 -sample 1e-4 -negative 5 -hs 0 -binary 0 -cbow 1 -iter 3\n\n");
    return 0;
  }
  output_file[0] = 0;
  save_vocab_file[0] = 0;
  read_vocab_file[0] = 0;
  if ((i = ArgPos((char *)"-size", argc, argv)) > 0) layer1_size = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-train", argc, argv)) > 0) strcpy(train_file, argv[i + 1]);
  if ((i = ArgPos((char *)"-save-vocab", argc, argv)) > 0) strcpy(save_vocab_file, argv[i + 1]);
  if ((i = ArgPos((char *)"-read-vocab", argc, argv)) > 0) strcpy(read_vocab_file, argv[i + 1]);
  if ((i = ArgPos((char *)"-debug", argc, argv)) > 0) debug_mode = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-binary", argc, argv)) > 0) binary = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-output-classifier", argc, argv)) > 0) strcpy(output_classifier, argv[i + 1]);
  if ((i = ArgPos((char *)"-cbow", argc, argv)) > 0) cbow = atoi(argv[i + 1]);
  if (cbow) alpha = 0.05;
  if ((i = ArgPos((char *)"-alpha", argc, argv)) > 0) alpha = atof(argv[i + 1]);
  if ((i = ArgPos((char *)"-output", argc, argv)) > 0) strcpy(output_file, argv[i + 1]);
  if ((i = ArgPos((char *)"-window", argc, argv)) > 0) window = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-sample", argc, argv)) > 0) sample = atof(argv[i + 1]);
  if ((i = ArgPos((char *)"-hs", argc, argv)) > 0) hs = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-negative", argc, argv)) > 0) negative = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-threads", argc, argv)) > 0) num_threads = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-iter", argc, argv)) > 0) iter = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-min-count", argc, argv)) > 0) min_count = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-classes", argc, argv)) > 0) classes = atoi(argv[i + 1]);
  vocab = (struct vocab_word *)calloc(vocab_max_size, sizeof(struct vocab_word));
  vocab_hash = (int *)calloc(vocab_hash_size, sizeof(int));
  expTable = (real *)malloc((EXP_TABLE_SIZE + 1) * sizeof(real));
  for (i = 0; i < EXP_TABLE_SIZE; i++) {
    expTable[i] = exp((i / (real)EXP_TABLE_SIZE * 2 - 1) * MAX_EXP); // Precompute the exp() table
    expTable[i] = expTable[i] / (expTable[i] + 1);                   // Precompute f(x) = x / (x + 1)
  }
  TrainModel();
  DestroyNet();
  free(vocab_hash);
  free(expTable);
  return 0;
}